

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::runInvariants
          (Interpreter *this,LocationRange *loc,HeapObject *self)

{
  bool bVar1;
  Frame *pFVar2;
  size_type sVar3;
  HeapObject *in_RDX;
  HeapThunk *thunk;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *thunks;
  HeapObject *in_stack_00000038;
  HeapEntity *in_stack_00000040;
  LocationRange *in_stack_00000048;
  Stack *in_stack_00000050;
  uint initial_stack_size;
  uint counter;
  uint in_stack_000035e4;
  AST *in_stack_000035e8;
  Interpreter *in_stack_000035f0;
  undefined4 in_stack_ffffffffffffff58;
  FrameKind in_stack_ffffffffffffff5c;
  LocationRange *in_stack_ffffffffffffff60;
  Stack *in_stack_ffffffffffffff68;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffb8;
  HeapObject *in_stack_ffffffffffffffc0;
  HeapObject *in_stack_ffffffffffffffc8;
  Interpreter *in_stack_ffffffffffffffd0;
  
  bVar1 = Stack::alreadyExecutingInvariants
                    (in_stack_ffffffffffffff68,(HeapObject *)in_stack_ffffffffffffff60);
  if (!bVar1) {
    Stack::size((Stack *)0x253dd6);
    LocationRange::LocationRange
              (in_stack_ffffffffffffff60,
               (LocationRange *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    (anonymous_namespace)::Stack::
    newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange>
              ((Stack *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               (LocationRange *)0x253e08);
    LocationRange::~LocationRange((LocationRange *)0x253e14);
    pFVar2 = Stack::top((Stack *)0x253e22);
    objectInvariants(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    sVar3 = std::
            vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            ::size(&pFVar2->thunks);
    if (sVar3 == 0) {
      Stack::pop((Stack *)in_stack_ffffffffffffff60);
    }
    else {
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::operator[](&pFVar2->thunks,0);
      pFVar2 = Stack::top((Stack *)0x253eb8);
      pFVar2->elementId = 1;
      pFVar2 = Stack::top((Stack *)0x253edd);
      pFVar2->self = in_RDX;
      Stack::newCall(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                     thunks._4_4_,(BindingFrame *)thunk);
      evaluate(in_stack_000035f0,in_stack_000035e8,in_stack_000035e4);
    }
  }
  return;
}

Assistant:

void runInvariants(const LocationRange &loc, HeapObject *self)
    {
        if (stack.alreadyExecutingInvariants(self))
            return;

        unsigned counter = 0;
        unsigned initial_stack_size = stack.size();
        stack.newFrame(FRAME_INVARIANTS, loc);
        std::vector<HeapThunk *> &thunks = stack.top().thunks;
        objectInvariants(self, self, counter, thunks);
        if (thunks.size() == 0) {
            stack.pop();
            return;
        }
        HeapThunk *thunk = thunks[0];
        stack.top().elementId = 1;
        stack.top().self = self;
        stack.newCall(loc, thunk, thunk->self, thunk->offset, thunk->upValues);
        evaluate(thunk->body, initial_stack_size);
    }